

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set_extra,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>,mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>>>>>
::produce<mvm::value_stack<mvm::list::mplist<unsigned_int>>,unsigned_int,unsigned_int>
          (interpreter<mvm::test::test_instr_set_extra,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>,mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>>>>>
           *this,uint *arg)

{
  value_stack<mvm::list::mplist<unsigned_int>_> *this_00;
  uint *arg_local;
  interpreter<mvm::test::test_instr_set_extra,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>,_mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>_>_>_>_>
  *this_local;
  
  this_00 = std::
            get<mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::value_stack<mvm::list::mplist<double>>>
                      ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
                        *)(this + 8));
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>(this_00,arg);
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce(T &&arg) {
  if constexpr (concept ::is_tuple_v<std::decay_t<T>>) {
    this->produce_unroll<IS>(
        std::forward<T>(arg),
        std::make_index_sequence<std::tuple_size<T>::value>());
  } else if constexpr (concept ::is_container_valid_v<std::decay_t<T>>) {
    for (auto sub : std::forward<T>(arg)) {
      std::get<IS>(m_instances)
          .template push<typename V::value_type>(std::move(sub));
    }
  } else {
    std::get<IS>(m_instances).template push<V>(std::forward<T>(arg));
  }
}